

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O1

void easm_print_expr(FILE *out,envy_colors *cols,easm_expr *expr,int lvl)

{
  char *pcVar1;
  char *__format;
  
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            for (; (lvl < 0 && (expr->type == EASM_EXPR_VEC)); expr = expr->e2) {
              easm_print_expr(out,cols,expr->e1,-1);
              lvl = 0;
              fprintf((FILE *)out,"%s:%s",cols->sym);
            }
            if ((0 < lvl) || (expr->type != EASM_EXPR_LOR)) break;
            easm_print_expr(out,cols,expr->e1,0);
            fprintf((FILE *)out,"%s||%s",cols->sym);
            expr = expr->e2;
            lvl = 1;
          }
          if ((1 < lvl) || (expr->type != EASM_EXPR_LAND)) break;
          easm_print_expr(out,cols,expr->e1,1);
          fprintf((FILE *)out,"%s&&%s",cols->sym);
          expr = expr->e2;
          lvl = 2;
        }
        if ((2 < lvl) || (expr->type != EASM_EXPR_OR)) break;
        easm_print_expr(out,cols,expr->e1,2);
        fprintf((FILE *)out,"%s|%s",cols->sym);
        expr = expr->e2;
        lvl = 3;
      }
      if ((3 < lvl) || (expr->type != EASM_EXPR_XOR)) break;
      easm_print_expr(out,cols,expr->e1,3);
      fprintf((FILE *)out,"%s^%s",cols->sym);
      expr = expr->e2;
      lvl = 4;
    }
    if ((4 < lvl) || (expr->type != EASM_EXPR_AND)) break;
    easm_print_expr(out,cols,expr->e1,4);
    fprintf((FILE *)out,"%s&%s",cols->sym);
    expr = expr->e2;
    lvl = 5;
  }
  if (lvl < 6) {
    if (expr->type == EASM_EXPR_SHR) {
      easm_print_expr(out,cols,expr->e1,5);
      pcVar1 = cols->sym;
      __format = "%s>>%s";
    }
    else {
      if (expr->type != EASM_EXPR_SHL) goto LAB_0024f1f8;
      easm_print_expr(out,cols,expr->e1,5);
      pcVar1 = cols->sym;
      __format = "%s<<%s";
    }
    fprintf((FILE *)out,__format,pcVar1);
    expr = expr->e2;
  }
LAB_0024f1f8:
  easm_print_sexpr(out,cols,expr,0);
  return;
}

Assistant:

void easm_print_expr(FILE *out, const struct envy_colors *cols, struct easm_expr *expr, int lvl) {
	if (lvl <= -1 && expr->type == EASM_EXPR_VEC) {
		easm_print_expr(out, cols, expr->e1, -1);
		fprintf(out, "%s:%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 0);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_LOR) {
		easm_print_expr(out, cols, expr->e1, 0);
		fprintf(out, "%s||%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 1);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_LAND) {
		easm_print_expr(out, cols, expr->e1, 1);
		fprintf(out, "%s&&%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_OR) {
		easm_print_expr(out, cols, expr->e1, 2);
		fprintf(out, "%s|%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 3);
	} else if (lvl <= 3 && expr->type == EASM_EXPR_XOR) {
		easm_print_expr(out, cols, expr->e1, 3);
		fprintf(out, "%s^%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 4);
	} else if (lvl <= 4 && expr->type == EASM_EXPR_AND) {
		easm_print_expr(out, cols, expr->e1, 4);
		fprintf(out, "%s&%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 5);
	} else if (lvl <= 5 && expr->type == EASM_EXPR_SHL) {
		easm_print_expr(out, cols, expr->e1, 5);
		fprintf(out, "%s<<%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 6);
	} else if (lvl <= 5 && expr->type == EASM_EXPR_SHR) {
		easm_print_expr(out, cols, expr->e1, 5);
		fprintf(out, "%s>>%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr->e2, 6);
	} else {
		easm_print_sexpr(out, cols, expr, 0);
	}
}